

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

void compactor_deregister_file(filemgr *file)

{
  avl_node **ppaVar1;
  avl_node *node;
  openfiles_elem_conflict query;
  char acStack_548 [1296];
  avl_node local_38 [2];
  
  strcpy(acStack_548,file->filename);
  pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
  node = avl_search(&openfiles,local_38,_compactor_cmp);
  if (node != (avl_node *)0x0) {
    ppaVar1 = &node[-1].left;
    *(int *)ppaVar1 = *(int *)ppaVar1 + -1;
    if (*(int *)ppaVar1 == 0) {
      if (*(char *)((long)&node[-1].left + 5) == '\x01') {
        node[-0xc].right = (avl_node *)0x0;
      }
      else {
        avl_remove(&openfiles,node);
        free(node + -0x36);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
  return;
}

Assistant:

void compactor_deregister_file(struct filemgr *file)
{
    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, file->filename);
    mutex_lock(&cpt_lock);
    a = avl_search(&openfiles, &query.avl, _compactor_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        if ((--elem->register_count) == 0) {
            // if no handle refers this file
            if (elem->daemon_compact_in_progress) {
                // This file is waiting for compaction by compactor (but not opened
                // yet). Do not remove 'elem' for now. The 'elem' will be automatically
                // replaced after the compaction is done by calling
                // 'compactor_switch_file()'. However, elem->file should be set to NULL
                // in order to be removed from the AVL tree in case of the compaction
                // failure.
                elem->file = NULL;
            } else {
                // remove from the tree
                avl_remove(&openfiles, &elem->avl);
                free(elem);
            }
        }
    }
    mutex_unlock(&cpt_lock);
}